

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

bool __thiscall
iDynTree::BerdyHelper::serializeSensorVariables
          (BerdyHelper *this,SensorsMeasurements *sensMeas,LinkNetExternalWrenches *netExtWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,
          LinkInternalWrenches *linkJointWrenches,SpatialForceVector *rcm,VectorDynSize *y)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  Index index;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long lVar12;
  pointer plVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  Index size;
  uint uVar18;
  IndexRange IVar19;
  Matrix<double,_6,_1,_0,_6,_1> ret_1;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  Wrench local_f8;
  undefined8 local_98 [4];
  undefined8 uStack_78;
  undefined8 local_70;
  Transform local_68 [8];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  uVar6 = iDynTree::SensorsMeasurements::toVector((VectorDynSize *)sensMeas);
  uVar7 = iDynTree::VectorDynSize::size();
  lVar8 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uVar9 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uVar10 = uVar7;
  if (((uVar9 & 7) == 0) && (uVar10 = (ulong)((uint)(uVar9 >> 3) & 1), (long)uVar7 <= (long)uVar10))
  {
    uVar10 = uVar7;
  }
  lVar15 = uVar7 - uVar10;
  if (0 < (long)uVar10) {
    uVar17 = 0;
    do {
      *(undefined8 *)(uVar9 + uVar17 * 8) = *(undefined8 *)(lVar8 + uVar17 * 8);
      uVar17 = uVar17 + 1;
    } while (uVar10 != uVar17);
  }
  uVar17 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
  if (1 < lVar15) {
    do {
      puVar11 = (undefined8 *)(lVar8 + uVar10 * 8);
      uVar3 = puVar11[1];
      puVar2 = (undefined8 *)(uVar9 + uVar10 * 8);
      *puVar2 = *puVar11;
      puVar2[1] = uVar3;
      uVar10 = uVar10 + 2;
    } while ((long)uVar10 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar7) {
    do {
      *(undefined8 *)(uVar9 + uVar17 * 8) = *(undefined8 *)(lVar8 + uVar17 * 8);
      uVar17 = uVar17 + 1;
    } while (uVar7 != uVar17);
  }
  if ((this->m_options).includeAllJointAccelerationsAsSensors == true) {
    lVar8 = iDynTree::Model::getNrOfDOFs();
    if (0 < lVar8) {
      uVar10 = 0;
      do {
        IVar19 = getRangeDOFSensorVariable(this,DOF_ACCELERATION_SENSOR,uVar10);
        puVar11 = (undefined8 *)
                  iDynTree::VectorDynSize::operator()((VectorDynSize *)jointAccs,uVar10);
        uVar3 = *puVar11;
        puVar11 = (undefined8 *)iDynTree::VectorDynSize::operator()(y,IVar19.offset);
        *puVar11 = uVar3;
        uVar10 = uVar10 + 1;
        lVar8 = iDynTree::Model::getNrOfDOFs();
      } while ((long)uVar10 < lVar8);
    }
  }
  if ((this->m_options).includeAllJointTorquesAsSensors == true) {
    lVar8 = iDynTree::Model::getNrOfDOFs();
    if (0 < lVar8) {
      uVar10 = 0;
      do {
        IVar19 = getRangeDOFSensorVariable(this,DOF_TORQUE_SENSOR,uVar10);
        puVar11 = (undefined8 *)
                  iDynTree::VectorDynSize::operator()((VectorDynSize *)jointTorques,uVar10);
        uVar3 = *puVar11;
        puVar11 = (undefined8 *)iDynTree::VectorDynSize::operator()(y,IVar19.offset);
        *puVar11 = uVar3;
        uVar10 = uVar10 + 1;
        lVar8 = iDynTree::Model::getNrOfDOFs();
      } while ((long)uVar10 < lVar8);
    }
  }
  if ((this->m_options).includeAllNetExternalWrenchesAsSensors == true) {
    lVar8 = iDynTree::Model::getNrOfLinks();
    if (0 < lVar8) {
      lVar8 = 0;
      do {
        if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
          iDynTree::Traversal::getBaseLink();
          lVar15 = iDynTree::Link::getIndex();
          if ((lVar8 != lVar15) || ((this->m_options).includeFixedBaseExternalWrench == true))
          goto LAB_001377d4;
        }
        else {
LAB_001377d4:
          IVar19 = getRangeLinkSensorVariable(this,NET_EXT_WRENCH_SENSOR,lVar8);
          lVar15 = IVar19.offset;
          iDynTree::Transform::inverse();
          iDynTree::LinkWrenches::operator()(netExtWrenches,lVar8);
          iDynTree::Transform::operator*(local_68,&local_f8);
          local_98[0] = local_60;
          local_98[1] = uStack_58;
          local_98[2] = local_50;
          local_98[3] = local_48;
          uStack_78 = uStack_40;
          local_70 = local_38;
          lVar12 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pvVar1 = (void *)(lVar12 + lVar15 * 8);
          uVar7 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1);
          uVar10 = 6;
          if (((ulong)pvVar1 & 7) == 0) {
            uVar10 = uVar7;
          }
          iVar16 = (int)uVar10;
          if (uVar10 != 0) {
            memcpy(pvVar1,local_98,(ulong)(uint)(iVar16 * 8));
          }
          uVar18 = 6 - iVar16;
          uVar9 = (uVar18 & 0xfffffffe) + uVar10;
          if (((ulong)pvVar1 & 7) == 0) {
            uVar17 = uVar7 + 2;
            if (uVar7 + 2 < uVar9) {
              uVar17 = uVar9;
            }
            memcpy((void *)(lVar12 + (lVar15 + uVar7) * 8),local_98 + uVar7,
                   ((~uVar7 + uVar17) * 8 & 0x7ffffffffffffff0) + 0x10);
          }
          if ((uint)uVar9 < 6) {
            memcpy((void *)(lVar12 + (lVar15 + uVar10 + (ulong)(uVar18 & 0xfffffffe)) * 8),
                   local_98 + ((uVar18 & 0xfffffffe) + iVar16),(ulong)(uVar18 * 8 & 8));
          }
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
        }
        lVar8 = lVar8 + 1;
        lVar15 = iDynTree::Model::getNrOfLinks();
      } while (lVar8 < lVar15);
    }
  }
  plVar13 = (this->berdySensorsInfo).wrenchSensors.super__Vector_base<long,_std::allocator<long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->berdySensorsInfo).wrenchSensors.super__Vector_base<long,_std::allocator<long>_>._M_impl
      .super__Vector_impl_data._M_finish != plVar13) {
    uVar10 = 0;
    do {
      lVar8 = plVar13[uVar10];
      iDynTree::IndexRange::InvalidRange();
      uVar4 = (this->berdySensorsInfo).jntIdxToOffset.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      lVar8 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                        ((Model *)&this->m_dynamicsTraversal,(long)this);
      lVar8 = iDynTree::LinkWrenches::operator()(linkJointWrenches,lVar8);
      local_f8._0_8_ = *(undefined8 *)(lVar8 + 8);
      local_f8._8_8_ = *(undefined8 *)(lVar8 + 0x10);
      local_f8._16_8_ = *(undefined8 *)(lVar8 + 0x18);
      local_f8._24_8_ = *(undefined8 *)(lVar8 + 0x20);
      local_f8._32_8_ = *(undefined8 *)(lVar8 + 0x28);
      local_f8._40_8_ = *(undefined8 *)(lVar8 + 0x30);
      lVar8 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      pvVar1 = (void *)(lVar8 + uVar4 * 8);
      uVar9 = (ulong)((uint)((ulong)pvVar1 >> 3) & 1);
      uVar7 = 6;
      if (((ulong)pvVar1 & 7) == 0) {
        uVar7 = uVar9;
      }
      if (uVar7 != 0) {
        memcpy(pvVar1,&local_f8,(ulong)(uint)((int)uVar7 * 8));
      }
      uVar18 = 6 - (int)uVar7;
      uVar17 = (uVar18 & 0xfffffffe) + uVar7;
      if (((ulong)pvVar1 & 7) == 0) {
        uVar14 = uVar9 + 2;
        if (uVar9 + 2 < uVar17) {
          uVar14 = uVar17;
        }
        memcpy((void *)(lVar8 + (uVar4 + uVar9) * 8),&local_f8.super_SpatialForceVector + uVar9 * 8,
               ((~uVar9 + uVar14) * 8 & 0x7ffffffffffffff0) + 0x10);
      }
      if ((uint)uVar17 < 6) {
        lVar15 = uVar7 + (uVar18 & 0xfffffffe);
        memcpy((void *)(lVar8 + (uVar4 + lVar15) * 8),
               &local_f8.super_SpatialForceVector + lVar15 * 8,(ulong)(uVar18 * 8 & 8));
      }
      uVar10 = uVar10 + 1;
      plVar13 = (this->berdySensorsInfo).wrenchSensors.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
    } while (uVar10 < (ulong)((long)(this->berdySensorsInfo).wrenchSensors.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)plVar13 >> 3));
  }
  if ((this->m_options).berdyVariant == BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES) {
    IVar19 = getRangeRCMSensorVariable(this,RCM_SENSOR);
    lVar8 = IVar19.offset;
    uVar5 = *(undefined8 *)(rcm + 8);
    local_f8._8_8_ = *(undefined8 *)(rcm + 0x10);
    local_f8._16_8_ = *(undefined8 *)(rcm + 0x18);
    local_f8._24_8_ = *(undefined8 *)(rcm + 0x20);
    local_f8._32_8_ = *(undefined8 *)(rcm + 0x28);
    uVar3 = *(undefined8 *)(rcm + 0x30);
    local_f8._0_8_ = uVar5;
    local_f8._40_8_ = uVar3;
    lVar15 = iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    puVar11 = (undefined8 *)(lVar15 + lVar8 * 8);
    if (((ulong)puVar11 & 7) == 0) {
      uVar18 = (uint)((ulong)puVar11 >> 3) & 1;
      if (((ulong)puVar11 >> 3 & 1) != 0) {
        *puVar11 = uVar5;
      }
      memcpy((void *)(lVar15 + ((ulong)uVar18 + lVar8) * 8),
             &local_f8.super_SpatialForceVector + uVar18 * 8,
             (ulong)((uVar18 * -8 + 0x30 & 0xfffffff0) + 0x38 & 0x30) + 0x10);
      if ((ulong)uVar18 != 0) {
        *(undefined8 *)(lVar15 + 0x28 + lVar8 * 8) = uVar3;
      }
    }
    else {
      puVar11[4] = local_f8._32_8_;
      puVar11[5] = local_f8._40_8_;
      puVar11[2] = local_f8._16_8_;
      puVar11[3] = local_f8._24_8_;
      *puVar11 = local_f8._0_8_;
      puVar11[1] = local_f8._8_8_;
    }
  }
  return (bool)uVar6;
}

Assistant:

bool BerdyHelper::serializeSensorVariables(SensorsMeasurements& sensMeas,
                                           LinkNetExternalWrenches& netExtWrenches,
                                           JointDOFsDoubleArray& jointTorques,
                                           JointDOFsDoubleArray& jointAccs,
                                           LinkInternalWrenches& linkJointWrenches,
                                           SpatialForceVector& rcm,
                                           VectorDynSize& y)
{
    bool ret=true;
    assert(y.size() == this->getNrOfSensorsMeasurements());

    bool ok = sensMeas.toVector(realSensorMeas);
    ret = ret && ok;

    // The first part of the sensor vector is exactly the serialization of the sensMeas object
    IndexRange ran;
    ran.offset = 0;
    ran.size = realSensorMeas.size();
    setSubVector(y,ran,toEigen(realSensorMeas));

    // Then we need to follow the serialization used in computeBerdySensorMatrices

     ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);

            setSubVector(y,sensorRange,jointAccs(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);

            setSubVector(y,sensorRange,jointTorques(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            if( !(m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                  m_dynamicsTraversal.getBaseLink()->getIndex() == idx) ||
                 m_options.includeFixedBaseExternalWrench  )
            {
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);

                setSubVector(y,sensorRange,toEigen(m_link_H_externalWrenchMeasurementFrame[idx].inverse()*netExtWrenches(idx)));
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);

        LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,berdySensorsInfo.wrenchSensors[i]);
        setSubVector(y,sensorRange,toEigen(linkJointWrenches(childLink)));
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM)
    ////////////////////////////////////////////////////////////////////////
    /// This method serializeSensorVariables is used in Testing for the Berdy estimator helper class
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        IndexRange sensorRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        setSubVector(y, sensorRange, rcm);
    }

    return ret;
}